

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O1

void __thiscall
draco::EntryValue::EntryValue<double>
          (EntryValue *this,vector<double,_std::allocator<double>_> *data)

{
  long lVar1;
  long lVar2;
  
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = *(long *)(data + 8);
  lVar2 = *(long *)data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,lVar1 - lVar2);
  memcpy((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,*(void **)data,lVar1 - lVar2);
  return;
}

Assistant:

explicit EntryValue(const std::vector<DataTypeT> &data) {
    const size_t total_size = sizeof(DataTypeT) * data.size();
    data_.resize(total_size);
    memcpy(&data_[0], &data[0], total_size);
  }